

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::ip_filter_updated(torrent *this)

{
  pointer paVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer addr;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> banned;
  torrent_state st;
  reason_t local_12c;
  _Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_128;
  undefined1 local_110 [48];
  torrent_state local_e0;
  
  if ((((this->field_0x5db & 2) != 0) &&
      ((this->super_torrent_hot_members).m_peer_list._M_t.
       super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
       .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl != (peer_list *)0x0)
      ) && ((this->m_ip_filter).
            super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0)) {
    get_peer_list_state(&local_e0,this);
    local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_start = (address *)0x0;
    local_128._M_impl.super__Vector_impl_data._M_finish = (address *)0x0;
    peer_list::apply_ip_filter
              ((this->super_torrent_hot_members).m_peer_list._M_t.
               super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
               .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,
               (this->m_ip_filter).
               super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_e0,
               (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               &local_128);
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    paVar1 = local_128._M_impl.super__Vector_impl_data._M_finish;
    if ((*(uint *)(CONCAT44(extraout_var,iVar2) + 0x68) >> 8 & 1) != 0) {
      for (addr = local_128._M_impl.super__Vector_impl_data._M_start; addr != paVar1;
          addr = addr + 1) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_110);
        boost::asio::ip::detail::endpoint::endpoint((endpoint *)(local_110 + 0x14),addr,0);
        local_12c = ip_filter;
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::peer_blocked_alert::reason_t>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_110,
                   (basic_endpoint<boost::asio::ip::tcp> *)(local_110 + 0x14),&local_12c);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
      }
    }
    peers_erased(this,&local_e0.erased);
    ::std::_Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
    ~_Vector_base(&local_128);
    ::std::
    _Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::~_Vector_base(&local_e0.erased.
                     super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   );
  }
  return;
}

Assistant:

void torrent::ip_filter_updated()
	{
		if (!m_apply_ip_filter) return;
		if (!m_peer_list) return;
		if (!m_ip_filter) return;

		torrent_state st = get_peer_list_state();
		std::vector<address> banned;
		m_peer_list->apply_ip_filter(*m_ip_filter, &st, banned);

		if (alerts().should_post<peer_blocked_alert>())
		{
			for (auto const& addr : banned)
				alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, tcp::endpoint(addr, 0)
					, peer_blocked_alert::ip_filter);
		}

		peers_erased(st.erased);
	}